

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEDate.cpp
# Opt level: O0

bool __thiscall test_CEDate::test_constructor(test_CEDate *this)

{
  initializer_list<double> __l;
  byte bVar1;
  double *in_RDI;
  CEDate test5;
  CEDate test4;
  CEDate test3;
  CEDate test2;
  CEDate test1;
  double jd_20190101;
  vector<double,_std::allocator<double>_> greg_20190101;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffcc0;
  allocator *paVar2;
  CEDate *in_stack_fffffffffffffcc8;
  double date;
  CEDate *in_stack_fffffffffffffcd0;
  CEDate *this_00;
  allocator_type *in_stack_fffffffffffffcd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffce0;
  iterator in_stack_fffffffffffffce8;
  size_type in_stack_fffffffffffffcf0;
  vector<double,_std::allocator<double>_> *__x;
  CEDate *this_01;
  undefined4 local_2d0;
  allocator local_2c9;
  string local_2c8 [32];
  double local_2a8;
  CEDate local_2a0;
  undefined4 local_260;
  allocator local_259;
  string local_258 [32];
  double local_238 [4];
  CEDate local_218;
  undefined4 local_1d8;
  undefined1 local_1d1 [33];
  double local_1b0;
  double local_1a8;
  CEDate local_1a0;
  undefined4 local_160;
  allocator local_159;
  string local_158 [32];
  vector<double,_std::allocator<double>_> *local_138;
  CEDate *local_130;
  CEDate local_128;
  undefined4 local_e8;
  allocator local_e1;
  string local_e0 [32];
  double local_c0;
  CEDate local_b8;
  undefined8 local_78 [4];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_48 = 0x3ff0000000000000;
  uStack_40 = 0x3fe0000000000000;
  local_58 = 0x409f8c0000000000;
  uStack_50 = 0x3ff0000000000000;
  local_30 = &local_58;
  local_28 = 4;
  std::allocator<double>::allocator((allocator<double> *)0x11d1bb);
  __l._M_len = in_stack_fffffffffffffcf0;
  __l._M_array = in_stack_fffffffffffffce8;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffce0,__l,in_stack_fffffffffffffcd8);
  std::allocator<double>::~allocator((allocator<double> *)0x11d1ef);
  local_78[0] = 0x4142c1ba80000000;
  CEDate::CurrentJD();
  CEDate::CEDate(in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8,
                 (CEDateType)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  local_c0 = CEDate::JD(&local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"test_constructor",&local_e1);
  local_e8 = 0x4e;
  CETestSuite::test_greaterthan(in_RDI,&local_c0,(string *)local_78,(int *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  CEDate::CEDate(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  this_01 = (CEDate *)CEDate::JD(&local_128);
  local_130 = this_01;
  __x = (vector<double,_std::allocator<double>_> *)CEDate::JD((CEDate *)(in_RDI + 0x44));
  paVar2 = &local_159;
  local_138 = __x;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"test_constructor",paVar2);
  local_160 = 0x52;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,&local_130,&local_138,local_158,&local_160);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  CEDate::operator_cast_to_double((CEDate *)0x11d3c1);
  CEDate::CEDate(in_stack_fffffffffffffcd0,(double)in_stack_fffffffffffffcc8,
                 (CEDateType)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
  local_1a8 = CEDate::JD(&local_1a0);
  local_1b0 = CEDate::JD((CEDate *)(in_RDI + 0x44));
  this_00 = (CEDate *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_1d1 + 1),"test_constructor",(allocator *)this_00);
  local_1d8 = 0x56;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,&local_1a8,&local_1b0,local_1d1 + 1,&local_1d8);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this_01,__x);
  CEDate::CEDate(this_01,__x);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffcc0);
  date = CEDate::JD(&local_218);
  paVar2 = &local_259;
  local_238[0] = date;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"test_constructor",paVar2);
  local_260 = 0x5a;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,local_238,local_78,local_258,&local_260);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  CEDate::CEDate(this_00,date,(CEDateType)((ulong)paVar2 >> 0x20));
  local_2a8 = CEDate::JD(&local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"test_constructor",&local_2c9);
  local_2d0 = 0x5e;
  (**(code **)((long)*in_RDI + 0x58))(in_RDI,&local_2a8,local_78,local_2c8,&local_2d0);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  bVar1 = (**(code **)((long)*in_RDI + 0x18))();
  CEDate::~CEDate((CEDate *)0x11d670);
  CEDate::~CEDate((CEDate *)0x11d67d);
  CEDate::~CEDate((CEDate *)0x11d68a);
  CEDate::~CEDate((CEDate *)0x11d697);
  CEDate::~CEDate((CEDate *)0x11d6a4);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)paVar2);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEDate::test_constructor(void)
{
    // Values for testing
    std::vector<double> greg_20190101 = {2019, 1.0, 1.0, 0.5};
    double              jd_20190101   = 2458485.0;

    // Default constructor. Because the default date is given as the current
    // date, the check is just that the value is greater than 01-01-2019
    CEDate test1;
    test_greaterthan(test1.JD(), jd_20190101, __func__, __LINE__);

    // Copy constructor
    CEDate test2(base_date_);
    test_double(test2.JD(), base_date_.JD(), __func__, __LINE__);

    // Copy assignment operator
    CEDate test3 = base_date_;
    test_double(test3.JD(), base_date_.JD(), __func__, __LINE__);

    // Construct from a vector
    CEDate test4(greg_20190101);
    test_double(test4.JD(), jd_20190101, __func__, __LINE__);

    // Construct from a Julian date
    CEDate test5(jd_20190101);
    test_double(test5.JD(), jd_20190101, __func__, __LINE__);

    return pass();
}